

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O3

int PAL_wcsncmp(char16_t *string1,char16_t *string2,size_t count)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (count != 0 && string1 != string2) {
    lVar2 = 0;
    do {
      iVar1 = (uint)(ushort)string1[lVar2] - (uint)(ushort)string2[lVar2];
      if (iVar1 != 0) {
        return iVar1;
      }
      if (string1[lVar2] == L'\0') {
        return 0;
      }
      bVar3 = count - 1 != lVar2;
      lVar2 = lVar2 + 1;
    } while (bVar3);
  }
  return 0;
}

Assistant:

int
__cdecl
PAL_wcsncmp(
        const char16_t *string1,
        const char16_t *string2,
        size_t count)
{
    size_t i;
    int diff = 0;

    PERF_ENTRY(wcsncmp);
    ENTRY("wcsncmp (string1=%p (%S), string2=%p (%S) count=%lu)\n",
          string1?string1:W16_NULLSTRING,
          string1?string1:W16_NULLSTRING, string2?string2:W16_NULLSTRING, string2?string2:W16_NULLSTRING,
          (unsigned long) count);

    if (string1 == string2) return diff;

    for (i = 0; i < count; i++)
    {
        diff = string1[i] - string2[i];
        if (diff != 0)
        {
            break;
        }

        /* stop if we reach the end of the string */
        if(string1[i]==0)
        {
            break;
        }
    }
    LOGEXIT("wcsncmp returning int %d\n", diff);
    PERF_EXIT(wcsncmp);
    return diff;
}